

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O0

char * read_alias(char *p,char *end)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int c;
  char *end_local;
  char *p_local;
  
  if ((((p < end) && (pcVar3 = p + 1, *p == '$')) && (pcVar3 < end)) &&
     ((iVar1 = isalnum((int)*pcVar3), iVar1 != 0 || (*pcVar3 == '_')))) {
    for (end_local = p + 2; end_local < end; end_local = end_local + 1) {
      iVar1 = (int)*end_local;
      if (iVar1 == 0x24) {
        return end_local + 1;
      }
      iVar2 = isalnum(iVar1);
      if ((iVar2 == 0) && (iVar1 != 0x5f)) {
        return (char *)0x0;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static inline const char* read_alias(const char* p, const char* end)
{
	if (p >= end || *p++ != '$')
		return 0;
	if (p >= end || (!std::isalnum(*p) && *p != '_'))
		return 0;
	for (++p; p < end;) {
		int c = *p;
		if (c == '$')
			return p + 1;
		else if (!std::isalnum(c) && c != '_')
			break;
		++p;
	}
	return 0;
}